

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase281::run(TestCase281 *this)

{
  bool bVar1;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  long local_190;
  Builder local_188;
  Builder foo;
  Builder root;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestGroups>
            (&root,&builder.super_MessageBuilder);
  local_188._builder.dataSize = root._builder.dataSize;
  local_188._builder.pointerCount = root._builder.pointerCount;
  local_188._builder._38_2_ = root._builder._38_2_;
  local_188._builder.data = root._builder.data;
  local_188._builder.pointers = root._builder.pointers;
  local_188._builder.segment = root._builder.segment;
  local_188._builder.capTable = root._builder.capTable;
  capnproto_test::capnp::test::TestGroups::Groups::Builder::initFoo(&foo,&local_188);
  *(undefined4 *)foo._builder.data = 0xbc614e;
  *(undefined8 *)((long)foo._builder.data + 8) = 0x7048860ddf79;
  value.super_StringPtr.content.size_ = 7;
  value.super_StringPtr.content.ptr = "foobar";
  capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::setGarply(&foo,value);
  if (*foo._builder.data != 0xbc614e && kj::_::Debug::minSeverity < 3) {
    local_188._builder.segment =
         (SegmentBuilder *)CONCAT44(local_188._builder.segment._4_4_,0xbc614e);
    local_190 = CONCAT44(local_190._4_4_,*foo._builder.data);
    kj::_::Debug::log<char_const(&)[48],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x123,ERROR,
               "\"failed: expected \" \"(12345678) == (foo.getCorge())\", 12345678, foo.getCorge()",
               (char (*) [48])"failed: expected (12345678) == (foo.getCorge())",(int *)&local_188,
               (int *)&local_190);
  }
  if ((*(long *)((long)foo._builder.data + 8) != 0x7048860ddf79) && (kj::_::Debug::minSeverity < 3))
  {
    local_188._builder.segment = (SegmentBuilder *)0x7048860ddf79;
    local_190 = *(long *)((long)foo._builder.data + 8);
    kj::_::Debug::log<char_const(&)[58],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x124,ERROR,
               "\"failed: expected \" \"(123456789012345ll) == (foo.getGrault())\", 123456789012345ll, foo.getGrault()"
               ,(char (*) [58])"failed: expected (123456789012345ll) == (foo.getGrault())",
               (longlong *)&local_188,&local_190);
  }
  capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::getGarply
            ((Builder *)&local_188,&foo);
  bVar1 = operator==("foobar",(Builder *)&local_188);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestGroups::Groups::Foo::Builder::getGarply
              ((Builder *)&local_188,&foo);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x125,ERROR,
               "\"failed: expected \" \"(\\\"foobar\\\") == (foo.getGarply())\", \"foobar\", foo.getGarply()"
               ,(char (*) [49])"failed: expected (\"foobar\") == (foo.getGarply())",
               (char (*) [7])"foobar",(Builder *)&local_188);
  }
  local_188._builder.dataSize = root._builder.dataSize;
  local_188._builder.pointerCount = root._builder.pointerCount;
  local_188._builder._38_2_ = root._builder._38_2_;
  local_188._builder.data = root._builder.data;
  local_188._builder.pointers = root._builder.pointers;
  local_188._builder.segment = root._builder.segment;
  local_188._builder.capTable = root._builder.capTable;
  capnproto_test::capnp::test::TestGroups::Groups::Builder::initBar((Builder *)&foo,&local_188);
  *(undefined4 *)foo._builder.data = 0x165ec15;
  value_00.super_StringPtr.content.size_ = 7;
  value_00.super_StringPtr.content.ptr = "barbaz";
  capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::setGrault((Builder *)&foo,value_00)
  ;
  *(undefined8 *)((long)foo._builder.data + 8) = 0xd55697c43ac0;
  if ((*foo._builder.data != 0x165ec15) && (kj::_::Debug::minSeverity < 3)) {
    local_188._builder.segment =
         (SegmentBuilder *)CONCAT44(local_188._builder.segment._4_4_,0x165ec15);
    local_190 = CONCAT44(local_190._4_4_,*foo._builder.data);
    kj::_::Debug::log<char_const(&)[48],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x12e,ERROR,
               "\"failed: expected \" \"(23456789) == (bar.getCorge())\", 23456789, bar.getCorge()",
               (char (*) [48])"failed: expected (23456789) == (bar.getCorge())",(int *)&local_188,
               (int *)&local_190);
  }
  capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::getGrault
            ((Builder *)&local_188,(Builder *)&foo);
  bVar1 = operator==("barbaz",(Builder *)&local_188);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestGroups::Groups::Bar::Builder::getGrault
              ((Builder *)&local_188,(Builder *)&foo);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x12f,ERROR,
               "\"failed: expected \" \"(\\\"barbaz\\\") == (bar.getGrault())\", \"barbaz\", bar.getGrault()"
               ,(char (*) [49])"failed: expected (\"barbaz\") == (bar.getGrault())",
               (char (*) [7])0x2cc7a3,(Builder *)&local_188);
  }
  if ((*(long *)((long)foo._builder.data + 8) != 0xd55697c43ac0) && (kj::_::Debug::minSeverity < 3))
  {
    local_188._builder.segment = (SegmentBuilder *)0xd55697c43ac0;
    local_190 = *(long *)((long)foo._builder.data + 8);
    kj::_::Debug::log<char_const(&)[58],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x130,ERROR,
               "\"failed: expected \" \"(234567890123456ll) == (bar.getGarply())\", 234567890123456ll, bar.getGarply()"
               ,(char (*) [58])"failed: expected (234567890123456ll) == (bar.getGarply())",
               (longlong *)&local_188,&local_190);
  }
  local_188._builder.dataSize = root._builder.dataSize;
  local_188._builder.pointerCount = root._builder.pointerCount;
  local_188._builder._38_2_ = root._builder._38_2_;
  local_188._builder.data = root._builder.data;
  local_188._builder.pointers = root._builder.pointers;
  local_188._builder.segment = root._builder.segment;
  local_188._builder.capTable = root._builder.capTable;
  capnproto_test::capnp::test::TestGroups::Groups::Builder::initBaz((Builder *)&foo,&local_188);
  *(undefined4 *)foo._builder.data = 0x20f76d2;
  value_01.super_StringPtr.content.size_ = 7;
  value_01.super_StringPtr.content.ptr = "bazqux";
  capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::setGrault((Builder *)&foo,value_01)
  ;
  value_02.super_StringPtr.content.size_ = 8;
  value_02.super_StringPtr.content.ptr = "quxquux";
  capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::setGarply((Builder *)&foo,value_02)
  ;
  if ((*foo._builder.data != 0x20f76d2) && (kj::_::Debug::minSeverity < 3)) {
    local_188._builder.segment =
         (SegmentBuilder *)CONCAT44(local_188._builder.segment._4_4_,0x20f76d2);
    local_190 = CONCAT44(local_190._4_4_,*foo._builder.data);
    kj::_::Debug::log<char_const(&)[48],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x139,ERROR,
               "\"failed: expected \" \"(34567890) == (baz.getCorge())\", 34567890, baz.getCorge()",
               (char (*) [48])"failed: expected (34567890) == (baz.getCorge())",(int *)&local_188,
               (int *)&local_190);
  }
  capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getGrault
            ((Builder *)&local_188,(Builder *)&foo);
  bVar1 = operator==("bazqux",(Builder *)&local_188);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getGrault
              ((Builder *)&local_188,(Builder *)&foo);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x13a,ERROR,
               "\"failed: expected \" \"(\\\"bazqux\\\") == (baz.getGrault())\", \"bazqux\", baz.getGrault()"
               ,(char (*) [49])"failed: expected (\"bazqux\") == (baz.getGrault())",
               (char (*) [7])"bazqux",(Builder *)&local_188);
  }
  capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getGarply
            ((Builder *)&local_188,(Builder *)&foo);
  bVar1 = operator==("quxquux",(Builder *)&local_188);
  if (!bVar1 && kj::_::Debug::minSeverity < 3) {
    capnproto_test::capnp::test::TestGroups::Groups::Baz::Builder::getGarply
              ((Builder *)&local_188,(Builder *)&foo);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[8],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x13b,ERROR,
               "\"failed: expected \" \"(\\\"quxquux\\\") == (baz.getGarply())\", \"quxquux\", baz.getGarply()"
               ,(char (*) [50])"failed: expected (\"quxquux\") == (baz.getGarply())",
               (char (*) [8])"quxquux",(Builder *)&local_188);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Encoding, Groups) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestGroups>();

  {
    auto foo = root.getGroups().initFoo();
    foo.setCorge(12345678);
    foo.setGrault(123456789012345ll);
    foo.setGarply("foobar");

    EXPECT_EQ(12345678, foo.getCorge());
    EXPECT_EQ(123456789012345ll, foo.getGrault());
    EXPECT_EQ("foobar", foo.getGarply());
  }

  {
    auto bar = root.getGroups().initBar();
    bar.setCorge(23456789);
    bar.setGrault("barbaz");
    bar.setGarply(234567890123456ll);

    EXPECT_EQ(23456789, bar.getCorge());
    EXPECT_EQ("barbaz", bar.getGrault());
    EXPECT_EQ(234567890123456ll, bar.getGarply());
  }

  {
    auto baz = root.getGroups().initBaz();
    baz.setCorge(34567890);
    baz.setGrault("bazqux");
    baz.setGarply("quxquux");

    EXPECT_EQ(34567890, baz.getCorge());
    EXPECT_EQ("bazqux", baz.getGrault());
    EXPECT_EQ("quxquux", baz.getGarply());
  }
}